

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O0

void __thiscall
GeneticAlgorithm::initializePopulation(GeneticAlgorithm *this,shared_ptr<Instance> *instance)

{
  element_type *peVar1;
  Individual local_158;
  shared_ptr<Instance> local_130;
  undefined1 local_120 [8];
  Result greedyResult;
  shared_ptr<Instance> local_c8;
  undefined1 local_b8 [8];
  Result lptfResult;
  Greedy greedy;
  LongestProcessingTimeFirst lptf;
  shared_ptr<Instance> local_68;
  Individual local_58;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  shared_ptr<Instance> *local_18;
  shared_ptr<Instance> *instance_local;
  GeneticAlgorithm *this_local;
  
  local_18 = instance;
  instance_local = (shared_ptr<Instance> *)this;
  std::make_shared<std::vector<Individual,std::allocator<Individual>>>();
  std::shared_ptr<std::vector<Individual,_std::allocator<Individual>_>_>::operator=
            (&this->population,
             (shared_ptr<std::vector<Individual,_std::allocator<Individual>_>_> *)local_28);
  std::shared_ptr<std::vector<Individual,_std::allocator<Individual>_>_>::~shared_ptr
            ((shared_ptr<std::vector<Individual,_std::allocator<Individual>_>_> *)local_28);
  for (local_2c = 0; local_2c < this->destinatedPopulationSize + -2; local_2c = local_2c + 1) {
    peVar1 = std::
             __shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->population);
    std::shared_ptr<Instance>::shared_ptr(&local_68,instance);
    Individual::makeRandom(&local_58,&local_68);
    std::vector<Individual,_std::allocator<Individual>_>::push_back(peVar1,&local_58);
    Individual::~Individual(&local_58);
    std::shared_ptr<Instance>::~shared_ptr(&local_68);
  }
  LongestProcessingTimeFirst::LongestProcessingTimeFirst((LongestProcessingTimeFirst *)&greedy);
  Greedy::Greedy((Greedy *)&lptfResult.longestProcessingTime);
  std::shared_ptr<Instance>::shared_ptr(&local_c8,instance);
  LongestProcessingTimeFirst::operator()
            ((Result *)local_b8,(LongestProcessingTimeFirst *)&greedy,&local_c8);
  std::shared_ptr<Instance>::~shared_ptr(&local_c8);
  peVar1 = std::
           __shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->population);
  Individual::Individual((Individual *)&greedyResult.longestProcessingTime,(Result *)local_b8);
  std::vector<Individual,_std::allocator<Individual>_>::push_back
            (peVar1,(value_type *)&greedyResult.longestProcessingTime);
  Individual::~Individual((Individual *)&greedyResult.longestProcessingTime);
  std::shared_ptr<Instance>::shared_ptr(&local_130,instance);
  Greedy::operator()((Result *)local_120,(Greedy *)&lptfResult.longestProcessingTime,&local_130);
  std::shared_ptr<Instance>::~shared_ptr(&local_130);
  peVar1 = std::
           __shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->population);
  Individual::Individual(&local_158,(Result *)local_120);
  std::vector<Individual,_std::allocator<Individual>_>::push_back(peVar1,&local_158);
  Individual::~Individual(&local_158);
  Result::~Result((Result *)local_120);
  Result::~Result((Result *)local_b8);
  Greedy::~Greedy((Greedy *)&lptfResult.longestProcessingTime);
  LongestProcessingTimeFirst::~LongestProcessingTimeFirst((LongestProcessingTimeFirst *)&greedy);
  return;
}

Assistant:

void GeneticAlgorithm::initializePopulation(std::shared_ptr<Instance> instance){
	population = std::make_shared<vector<Individual>>();

	for(int i = 0; i < destinatedPopulationSize-2; i++){
		population->push_back(Individual::makeRandom(instance));
	}

	LongestProcessingTimeFirst lptf;
	Greedy greedy;
	auto lptfResult = lptf(instance);
	population->push_back( (Individual)lptfResult );
	auto greedyResult = greedy(instance);
	population->push_back( (Individual)greedyResult );
}